

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

void handle_server_error(cio_http_client *client,char *msg)

{
  code *pcVar1;
  cio_error cVar2;
  
  pcVar1 = *(code **)((long)(client->parser).data + 0xa8);
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)();
  }
  cVar2 = write_response(client,CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR,(cio_write_buffer *)0x0,
                         (cio_response_written_cb_t)0x0);
  if (cVar2 == CIO_SUCCESS) {
    return;
  }
  mark_to_be_closed(client);
  return;
}

Assistant:

static void handle_server_error(struct cio_http_client *client, const char *msg)
{
	struct cio_http_server *server = cio_http_client_get_server(client);
	handle_error(server, msg);
	enum cio_error err = write_response(client, CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR, NULL, NULL);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		mark_to_be_closed(client);
	}
}